

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::DrawTest::iterate(DrawTest *this)

{
  int *piVar1;
  Storage *this_00;
  int iVar2;
  uint uVar3;
  IndexType IVar4;
  Storage SVar5;
  pointer pAVar6;
  pointer ppAVar7;
  size_t __n;
  DrawTestSpec *pDVar8;
  Usage usage;
  int iVar9;
  Float<unsigned_short,_5,_10,_15,_1U> FVar10;
  Float<unsigned_short,_5,_10,_15,_1U> FVar11;
  Float<unsigned_short,_5,_10,_15,_1U> FVar12;
  CompatibilityTestType CVar13;
  int iVar14;
  int iVar15;
  deUint32 dVar16;
  deUint32 dVar17;
  deUint32 dVar18;
  Float<unsigned_int,_8,_23,_127,_3U> FVar19;
  Float<unsigned_int,_8,_23,_127,_3U> FVar20;
  deUint32 dVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  pointer pAVar26;
  ulong uVar27;
  AttributeArray *pAVar28;
  AttributeArray *this_01;
  undefined8 uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  char cVar33;
  byte bVar34;
  byte bVar35;
  short sVar36;
  ushort uVar37;
  ushort uVar38;
  int iVar39;
  InputType IVar40;
  InputType IVar41;
  uint uVar42;
  size_t sVar43;
  int i;
  ulong uVar44;
  uint uVar45;
  anon_union_8_10_1f5805e9_for_GLValue_1 aVar46;
  TestLog *log;
  DrawTest *pDVar47;
  long lVar48;
  long lVar49;
  InputType IVar50;
  uint uVar51;
  char cVar52;
  short sVar53;
  undefined2 uVar54;
  ulong uVar55;
  TestContext **ppTVar56;
  uint *puVar57;
  char *pcVar58;
  char cVar59;
  short sVar60;
  int iVar61;
  bool bVar62;
  deUint32 u32;
  float fVar63;
  char *pcVar64;
  undefined8 uVar65;
  GLValue GVar66;
  GLValue GVar67;
  Float<unsigned_int,_8,_23,_127,_3U> local_2fc;
  ulong local_2f8;
  long local_2f0;
  uint local_2e4;
  DrawTest *local_2e0;
  char *local_2d8;
  long local_2d0;
  byte local_2c1;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_2c0;
  char *local_2b8;
  float afStack_2b0 [2];
  ulong local_2a8;
  DrawTestSpec *local_2a0;
  deRandom rnd_4;
  Random random;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [2];
  Vec4 retVal;
  IterationLogSectionEmitter sectionEmitter;
  AttributeSpec attribSpec;
  ios_base local_140 [272];
  
  iVar2 = this->m_iteration;
  bVar62 = (long)iVar2 == 0;
  iVar61 = iVar2 % 2;
  local_2a0 = (this->m_specs).
              super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>.
              _M_impl.super__Vector_impl_data._M_start;
  lVar24 = (long)(this->m_specs).
                 super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)local_2a0;
  lVar32 = lVar24 >> 4;
  sVar43 = (size_t)(iVar2 / 2);
  local_2a0 = local_2a0 + sVar43;
  local_2e0 = this;
  if (iVar61 == 0 && !bVar62) {
    pAVar26 = (local_2a0->attribs).
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar6 = local_2a0[-1].attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar48 = (long)(local_2a0->attribs).
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar26;
    bVar62 = lVar48 != (long)local_2a0[-1].attribs.
                             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6;
    if (lVar48 != 0 && !bVar62) {
      lVar48 = (lVar48 >> 3) * -0x3333333333333333;
      lVar48 = lVar48 + (ulong)(lVar48 == 0);
      lVar49 = 4;
      do {
        bVar62 = true;
        if (*(char *)((long)&pAVar26->instanceDivisor + lVar49 + 1) !=
            *(char *)((long)&pAVar6->instanceDivisor + lVar49 + 1)) goto LAB_01868691;
        uVar51 = *(uint *)((long)&pAVar26->inputType + lVar49);
        if ((3 < uVar51) || (3 < *(uint *)((long)&pAVar6->inputType + lVar49))) {
          if (0xb < uVar51) goto LAB_01868691;
          if ((0x1d0U >> (uVar51 & 0x1f) & 1) == 0) {
            if ((0xe20U >> (uVar51 & 0x1f) & 1) == 0) goto LAB_01868691;
          }
          else {
            uVar30 = *(uint *)((long)&pAVar6->inputType + lVar49);
            if ((uVar30 < 9) && ((0x1d0U >> (uVar30 & 0x1f) & 1) != 0)) goto LAB_01868896;
            if (uVar51 != 5) goto LAB_01868691;
          }
          iVar39 = *(int *)((long)&pAVar6->inputType + lVar49);
          if ((2 < iVar39 - 9U) && (iVar39 != 5)) goto LAB_01868691;
        }
LAB_01868896:
        lVar49 = lVar49 + 0x28;
        lVar48 = lVar48 + -1;
      } while (lVar48 != 0);
      bVar62 = false;
      goto LAB_01868691;
    }
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  }
  else {
LAB_01868691:
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    if (iVar61 != 0) {
      sectionEmitter.m_enabled = false;
      if (iVar61 != 1) {
        return STOP;
      }
      sectionEmitter.m_log = log;
      bVar62 = compare(this,local_2a0->primitive);
      if (!bVar62) {
        CVar13 = DrawTestSpec::isCompatibilityTest(local_2a0);
        piVar1 = &attribSpec.componentCount;
        attribSpec._0_8_ = piVar1;
        if (CVar13 == COMPATIBILITY_UNALIGNED_STRIDE) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&attribSpec,"Failed to draw with unaligned stride.","");
          tcu::ResultCollector::addResult
                    (&local_2e0->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec
                    );
        }
        else if (CVar13 == COMPATIBILITY_UNALIGNED_OFFSET) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&attribSpec,"Failed to draw with unaligned buffers.","");
          tcu::ResultCollector::addResult
                    (&local_2e0->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec
                    );
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&attribSpec,"Image comparison failed.","");
          tcu::ResultCollector::addResult
                    (&local_2e0->m_result,QP_TEST_RESULT_FAIL,(string *)&attribSpec);
        }
        this = local_2e0;
        if ((int *)attribSpec._0_8_ != piVar1) {
          operator_delete((void *)attribSpec._0_8_,attribSpec._16_8_ + 1);
          this = local_2e0;
        }
      }
      goto LAB_0186a56e;
    }
  }
  ppTVar56 = &(this->super_TestCase).super_TestNode.m_testCtx;
  anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
            (&sectionEmitter,log,sVar43,lVar32 * -0x3333333333333333,
             (this->m_iteration_descriptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + sVar43,lVar24 != 0x50);
  pDVar8 = local_2a0;
  uVar51 = *(uint *)(gls::(anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)
                     ::infos + (long)(int)local_2a0->drawMethod * 6);
  pDVar47 = (DrawTest *)(ulong)uVar51;
  uVar38 = *(ushort *)
            (gls::(anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
            (long)(int)local_2a0->drawMethod * 6 + 4);
  if (local_2a0->primitive < PRIMITIVE_LAST) {
    lVar24 = (long)local_2a0->primitiveCount;
    switch(local_2a0->primitive) {
    case PRIMITIVE_POINTS:
      break;
    default:
      lVar24 = lVar24 + 2;
      break;
    case PRIMITIVE_LINES:
      lVar24 = lVar24 * 2;
      break;
    case PRIMITIVE_LINE_STRIP:
      lVar24 = lVar24 + 1;
      break;
    case PRIMITIVE_LINE_LOOP:
      if (local_2a0->primitiveCount == 1) {
        lVar24 = 2;
      }
      break;
    case PRIMITIVE_LINES_ADJACENCY:
      lVar24 = lVar24 << 2;
      break;
    case PRIMITIVE_LINE_STRIP_ADJACENCY:
      lVar24 = lVar24 + 3;
      break;
    case PRIMITIVE_TRIANGLES_ADJACENCY:
      lVar24 = lVar24 * 2;
    case PRIMITIVE_TRIANGLES:
      lVar24 = lVar24 * 3;
      break;
    case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
      lVar24 = lVar24 * 2 + 4;
    }
  }
  else {
    lVar24 = 0;
  }
  uVar30 = 0;
  if ((uVar51 >> 0x10 & 1) != 0) {
    uVar30 = local_2a0->indexMin;
  }
  iVar61 = 0;
  if ((uVar51 >> 0x18 & 1) != 0) {
    iVar61 = local_2a0->first;
  }
  uVar3 = local_2a0->baseVertex;
  uVar42 = 0;
  if (0 < (int)uVar3) {
    uVar42 = uVar3;
  }
  uVar3 = (int)uVar3 >> 0x1f & -uVar3;
  if ((uVar38 & 1) == 0) {
    uVar3 = 0;
  }
  iVar39 = (int)lVar24;
  uVar31 = iVar61 + -1 + uVar30 + iVar39;
  if ((uVar51 >> 0x10 & 1) != 0) {
    uVar45 = local_2a0->indexMax;
    if ((int)uVar45 < (int)uVar31) {
      uVar31 = uVar45;
    }
    if ((int)uVar45 < 0) {
      uVar31 = 0;
    }
  }
  local_2e4 = 0;
  if (0 < (int)uVar31) {
    local_2e4 = uVar31;
  }
  local_268[1]._12_4_ = getCoordScale(pDVar47,local_2a0);
  local_268[1]._8_4_ = getColorScale(pDVar47,pDVar8);
  attribSpec._0_8_ = (*ppTVar56)->m_log;
  this_00 = &attribSpec.storage;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  DrawTestSpec::getMultilineDesc_abi_cxx11_((string *)&random,local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(char *)random.m_rnd._0_8_,random.m_rnd._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)random.m_rnd._0_8_ != local_268) {
    operator_delete((void *)random.m_rnd._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::ios_base::~ios_base(local_140);
  attribSpec._0_8_ = (*ppTVar56)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&attribSpec.storage);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar25 = lVar24 + (int)uVar30 +
           (long)iVar61 +
           (ulong)((uint)((long)((ulong)CONCAT24(uVar38,uVar51) << 0x1f) >> 0x3f) & uVar42);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&attribSpec.storage);
  std::ios_base::~ios_base(local_140);
  pDVar47 = local_2e0;
  AttributePack::clearArrays(local_2e0->m_glArrayPack);
  AttributePack::clearArrays(pDVar47->m_rrArrayPack);
  pAVar26 = (local_2a0->attribs).
            super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_2a0->attribs).
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar26) >> 3) *
          -0x33333333) {
    uVar55 = 0;
    do {
      pDVar8 = local_2a0;
      pAVar6 = pAVar26 + uVar55;
      uVar29._0_4_ = pAVar6->instanceDivisor;
      uVar29._4_1_ = pAVar6->useDefaultAttribute;
      uVar29._5_1_ = pAVar6->additionalPositionAttribute;
      uVar29._6_1_ = pAVar6->bgraComponentOrder;
      uVar29._7_1_ = pAVar6->field_0x27;
      pAVar6 = pAVar26 + uVar55;
      attribSpec.inputType = pAVar6->inputType;
      attribSpec.outputType = pAVar6->outputType;
      attribSpec.storage = pAVar6->storage;
      attribSpec.usage = pAVar6->usage;
      pAVar26 = pAVar26 + uVar55;
      attribSpec.componentCount = pAVar26->componentCount;
      attribSpec.offset = pAVar26->offset;
      attribSpec.stride = pAVar26->stride;
      attribSpec.normalize = pAVar26->normalize;
      attribSpec._29_3_ = *(undefined3 *)&pAVar26->field_0x1d;
      local_2c1 = uVar55 == 0 | uVar29._5_1_;
      attribSpec._32_8_ = uVar29;
      iVar61 = DrawTestSpec::AttributeSpec::hash(&attribSpec);
      iVar14 = DrawTestSpec::hash(pDVar8);
      IVar50 = attribSpec.inputType;
      if (uVar29._4_1_ != true) {
        iVar9 = attribSpec.componentCount;
        local_2a8 = (ulong)attribSpec.componentCount;
        iVar15 = DrawTestSpec::inputTypeSize::size[(int)attribSpec.inputType] *
                 attribSpec.componentCount;
        local_2d0 = (long)attribSpec.stride;
        if ((long)attribSpec.stride == 0) {
          local_2d0 = (long)iVar15;
        }
        local_2f8 = uVar25;
        if ((0 < attribSpec.instanceDivisor & (byte)(uVar51 >> 8)) == 1) {
          local_2f8 = (ulong)(local_2a0->instanceCount / attribSpec.instanceDivisor + 1);
        }
        if (((uVar51 >> 0x10 & 1) != 0) &&
           (uVar27 = (ulong)(local_2a0->indexMax + 1), local_2f8 <= uVar27)) {
          local_2f8 = uVar27;
        }
        dVar21 = iVar61 + (int)uVar55 + iVar14 * 100;
        local_2f0 = (long)attribSpec.offset;
        if ((attribSpec.inputType & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                   attribSpec.offset) + 4);
          deRandom_init(&random.m_rnd,dVar21);
          lVar24 = local_2f0;
          if (0 < (int)local_2f8) {
            puVar57 = (uint *)(local_2d8 + local_2f0);
            uVar27 = local_2f8 & 0xffffffff;
            do {
              dVar21 = deRandom_getUint32(&random.m_rnd);
              dVar16 = deRandom_getUint32(&random.m_rnd);
              dVar17 = deRandom_getUint32(&random.m_rnd);
              dVar18 = deRandom_getUint32(&random.m_rnd);
              *puVar57 = (dVar16 & 0x3ff) << 10 | (dVar17 & 0x3ff) << 0x14 | dVar18 << 0x1e |
                         dVar21 & 0x3ff;
              puVar57 = (uint *)((long)puVar57 + local_2d0);
              uVar42 = (int)uVar27 - 1;
              uVar27 = (ulong)uVar42;
              lVar24 = local_2f0;
            } while (uVar42 != 0);
          }
        }
        else if (attribSpec.inputType < INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          uVar27 = (ulong)(uint)attribSpec.componentCount;
          switch(attribSpec._0_8_ & 0xffffffff) {
          case 0:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FLOAT);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FLOAT);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 4);
            deRandom_init((deRandom *)&retVal,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              pcVar58 = local_2d8 + local_2f0;
              local_2c0.fl.m_value = (Float)(Float)GVar67.field_1._0_4_;
              local_2b8 = (char *)CONCAT44(local_2b8._4_4_,GVar66.type);
              local_2a8 = CONCAT44(local_2a8._4_4_,GVar67.field_1._0_4_ - (float)GVar66.type);
              iVar61 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  do {
                    fVar63 = local_2b8._0_4_;
                    if (local_2b8._0_4_ <= (float)local_2c0._0_4_) {
                      fVar63 = deRandom_getFloat((deRandom *)&retVal);
                      fVar63 = fVar63 * (float)local_2a8 + local_2b8._0_4_;
                    }
                    (&rnd_4.x)[uVar44] = (deUint32)fVar63;
                    if ((iVar61 != 0) &&
                       (ABS(fVar63 - *(float *)((long)local_268 + uVar44 * 4 + -0x10)) < 4.0)) {
                      fVar63 = local_2b8._0_4_;
                      if (local_2b8._0_4_ <= (float)local_2c0._0_4_) {
                        fVar63 = deRandom_getFloat((deRandom *)&retVal);
                        fVar63 = fVar63 * (float)local_2a8 + local_2b8._0_4_;
                      }
                      (&rnd_4.x)[uVar44] = (deUint32)fVar63;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&random,&rnd_4,uVar27 * 4);
                  memcpy(pcVar58,&rnd_4,uVar27 * 4);
                }
                pcVar58 = pcVar58 + local_2d0;
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 1:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FIXED);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FIXED);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 4);
            deRandom_init((deRandom *)&retVal,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2d8 + local_2f0);
              iVar61 = GVar67.field_1._0_4_;
              IVar50 = GVar66.type;
              local_2b8 = (char *)(uVar27 * 4);
              iVar14 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2c0 = aVar46;
                  do {
                    IVar40 = IVar50;
                    if ((int)IVar50 < iVar61) {
                      dVar21 = deRandom_getUint32((deRandom *)&retVal);
                      IVar40 = dVar21 % (iVar61 - IVar50) + IVar50;
                    }
                    (&rnd_4.x)[uVar44] = IVar40;
                    if ((iVar14 != 0) &&
                       ((IVar40 - *(int *)((long)local_268 + uVar44 * 4 + -0x10) & 0x7ffc) == 0)) {
                      IVar40 = IVar50;
                      if ((int)IVar50 < iVar61) {
                        dVar21 = deRandom_getUint32((deRandom *)&retVal);
                        IVar40 = dVar21 % (iVar61 - IVar50) + IVar50;
                      }
                      (&rnd_4.x)[uVar44] = IVar40;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&random,&rnd_4,(size_t)local_2b8);
                  aVar46 = local_2c0;
                  memcpy((void *)local_2c0,&rnd_4,(size_t)local_2b8);
                }
                aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + local_2d0);
                iVar14 = iVar14 + 1;
                lVar24 = local_2f0;
              } while (iVar14 != (int)local_2f8);
            }
            break;
          case 2:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_DOUBLE);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_DOUBLE);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 8);
            deRandom_init(&rnd_4,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              pcVar58 = local_2d8 + local_2f0;
              local_2a8 = CONCAT44(local_2a8._4_4_,
                                   (float)(double)GVar67.field_1 - (float)(double)GVar66._0_8_);
              iVar61 = 0;
              local_2c0 = GVar67.field_1;
              local_2b8 = GVar66._0_8_;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  do {
                    pcVar64 = local_2b8;
                    if ((double)local_2b8 <= (double)local_2c0) {
                      fVar63 = deRandom_getFloat(&rnd_4);
                      pcVar64 = (char *)((double)(fVar63 * (float)local_2a8) + (double)local_2b8);
                    }
                    *(char **)(retVal.m_data + uVar44 * 2) = pcVar64;
                    if ((iVar61 != 0) &&
                       (ABS((float)((double)pcVar64 -
                                   *(double *)((long)local_268 + uVar44 * 8 + -0x10))) < 4.0)) {
                      pcVar64 = local_2b8;
                      if ((double)local_2b8 <= (double)local_2c0) {
                        fVar63 = deRandom_getFloat(&rnd_4);
                        pcVar64 = (char *)((double)(fVar63 * (float)local_2a8) + (double)local_2b8);
                      }
                      *(char **)(retVal.m_data + uVar44 * 2) = pcVar64;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&random,&retVal,uVar27 * 8);
                  memcpy(pcVar58,&retVal,uVar27 * 8);
                }
                pcVar58 = pcVar58 + local_2d0;
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 3:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_BYTE);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_BYTE);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8);
            deRandom_init(&random.m_rnd,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              pcVar58 = local_2d8 + local_2f0;
              cVar59 = GVar67.field_1._0_1_;
              cVar52 = (char)GVar66.type;
              iVar61 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2b8 = pcVar58;
                  do {
                    cVar33 = cVar52;
                    if (cVar52 < cVar59) {
                      dVar21 = deRandom_getUint32(&random.m_rnd);
                      cVar33 = (char)(dVar21 % (uint)((int)cVar59 - (int)cVar52)) + cVar52;
                    }
                    *(char *)((long)&rnd_4.x + uVar44) = cVar33;
                    if ((iVar61 != 0) &&
                       ((cVar33 - *(char *)((long)retVal.m_data + uVar44) & 0x7cU) == 0)) {
                      cVar33 = cVar52;
                      if (cVar52 < cVar59) {
                        dVar21 = deRandom_getUint32(&random.m_rnd);
                        cVar33 = (char)(dVar21 % (uint)((int)cVar59 - (int)cVar52)) + cVar52;
                      }
                      *(char *)((long)&rnd_4.x + uVar44) = cVar33;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&retVal,&rnd_4,uVar27);
                  pcVar58 = local_2b8;
                  memcpy(local_2b8,&rnd_4,uVar27);
                }
                pcVar58 = pcVar58 + local_2d0;
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 4:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_SHORT);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_SHORT);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 2);
            deRandom_init(&random.m_rnd,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2d8 + local_2f0);
              sVar60 = GVar67.field_1._0_2_;
              sVar53 = (short)GVar66.type;
              local_2b8 = (char *)(uVar27 * 2);
              iVar61 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2c0 = aVar46;
                  do {
                    sVar36 = sVar53;
                    if (sVar53 < sVar60) {
                      dVar21 = deRandom_getUint32(&random.m_rnd);
                      sVar36 = (short)(dVar21 % (uint)((int)sVar60 - (int)sVar53)) + sVar53;
                    }
                    *(short *)((long)&rnd_4.x + uVar44 * 2) = sVar36;
                    if ((iVar61 != 0) &&
                       ((sVar36 - *(short *)((long)retVal.m_data + uVar44 * 2) & 0x7c00U) == 0)) {
                      sVar36 = sVar53;
                      if (sVar53 < sVar60) {
                        dVar21 = deRandom_getUint32(&random.m_rnd);
                        sVar36 = (short)(dVar21 % (uint)((int)sVar60 - (int)sVar53)) + sVar53;
                      }
                      *(short *)((long)&rnd_4.x + uVar44 * 2) = sVar36;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&retVal,&rnd_4,(size_t)local_2b8);
                  aVar46 = local_2c0;
                  memcpy((void *)local_2c0,&rnd_4,(size_t)local_2b8);
                }
                aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + local_2d0);
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 5:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_BYTE);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8);
            deRandom_init(&random.m_rnd,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              pcVar58 = local_2d8 + local_2f0;
              uVar42 = (GVar67.field_1._0_4_ & 0xff) - (GVar66.type & 0xff);
              iVar61 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2b8 = pcVar58;
                  do {
                    bVar35 = (byte)GVar66.type;
                    bVar34 = bVar35;
                    if (bVar35 < GVar67.field_1._0_1_) {
                      dVar21 = deRandom_getUint32(&random.m_rnd);
                      bVar34 = (char)(dVar21 % uVar42) + bVar35;
                    }
                    *(byte *)((long)&rnd_4.x + uVar44) = bVar34;
                    if ((iVar61 != 0) &&
                       ((byte)(bVar34 - *(char *)((long)retVal.m_data + uVar44)) < 8)) {
                      if (bVar35 < GVar67.field_1._0_1_) {
                        dVar21 = deRandom_getUint32(&random.m_rnd);
                        bVar35 = (char)(dVar21 % uVar42) + bVar35;
                      }
                      *(byte *)((long)&rnd_4.x + uVar44) = bVar35;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&retVal,&rnd_4,uVar27);
                  pcVar58 = local_2b8;
                  memcpy(local_2b8,&rnd_4,uVar27);
                }
                pcVar58 = pcVar58 + local_2d0;
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 6:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_SHORT);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 2);
            deRandom_init(&random.m_rnd,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2d8 + local_2f0);
              uVar42 = (GVar67.field_1._0_4_ & 0xffff) - (GVar66.type & 0xffff);
              local_2b8 = (char *)(uVar27 * 2);
              iVar61 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2c0 = aVar46;
                  do {
                    uVar38 = (ushort)GVar66.type;
                    uVar37 = uVar38;
                    if (uVar38 < GVar67.field_1._0_2_) {
                      dVar21 = deRandom_getUint32(&random.m_rnd);
                      uVar37 = (short)(dVar21 % uVar42) + uVar38;
                    }
                    *(ushort *)((long)&rnd_4.x + uVar44 * 2) = uVar37;
                    if ((iVar61 != 0) &&
                       ((ushort)(uVar37 - *(short *)((long)retVal.m_data + uVar44 * 2)) < 0x400)) {
                      if (uVar38 < GVar67.field_1._0_2_) {
                        dVar21 = deRandom_getUint32(&random.m_rnd);
                        uVar38 = (short)(dVar21 % uVar42) + uVar38;
                      }
                      *(ushort *)((long)&rnd_4.x + uVar44 * 2) = uVar38;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&retVal,&rnd_4,(size_t)local_2b8);
                  aVar46 = local_2c0;
                  memcpy((void *)local_2c0,&rnd_4,(size_t)local_2b8);
                }
                aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + local_2d0);
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 7:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_INT);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_INT);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 4);
            deRandom_init((deRandom *)&retVal,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2d8 + local_2f0);
              iVar61 = GVar67.field_1._0_4_;
              IVar50 = GVar66.type;
              local_2b8 = (char *)(uVar27 * 4);
              iVar14 = 0;
              do {
                if (0 < iVar9) {
                  uVar44 = 0;
                  local_2c0 = aVar46;
                  do {
                    IVar40 = IVar50;
                    if ((int)IVar50 < iVar61) {
                      dVar21 = deRandom_getUint32((deRandom *)&retVal);
                      IVar40 = dVar21 % (iVar61 - IVar50) + IVar50;
                    }
                    (&rnd_4.x)[uVar44] = IVar40;
                    if ((iVar14 != 0) &&
                       ((IVar40 - *(int *)((long)local_268 + uVar44 * 4 + -0x10) & 0x7c000000) == 0)
                       ) {
                      IVar40 = IVar50;
                      if ((int)IVar50 < iVar61) {
                        dVar21 = deRandom_getUint32((deRandom *)&retVal);
                        IVar40 = dVar21 % (iVar61 - IVar50) + IVar50;
                      }
                      (&rnd_4.x)[uVar44] = IVar40;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&random,&rnd_4,(size_t)local_2b8);
                  aVar46 = local_2c0;
                  memcpy((void *)local_2c0,&rnd_4,(size_t)local_2b8);
                }
                aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + local_2d0);
                iVar14 = iVar14 + 1;
                lVar24 = local_2f0;
              } while (iVar14 != (int)local_2f8);
            }
            break;
          case 8:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_INT);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 4);
            deRandom_init((deRandom *)&retVal,dVar21);
            lVar24 = local_2f0;
            if (0 < (int)local_2f8) {
              aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2d8 + local_2f0);
              IVar50 = GVar67.field_1._0_4_;
              IVar40 = GVar66.type;
              uVar27 = local_2a8 & 0xffffffff;
              local_2b8 = (char *)(uVar27 * 4);
              iVar61 = 0;
              do {
                if (0 < (int)(float)local_2a8) {
                  uVar44 = 0;
                  local_2c0 = aVar46;
                  do {
                    IVar41 = IVar40;
                    if (IVar40 < IVar50) {
                      dVar21 = deRandom_getUint32((deRandom *)&retVal);
                      IVar41 = dVar21 % (IVar50 - IVar40) + IVar40;
                    }
                    (&rnd_4.x)[uVar44] = IVar41;
                    if ((iVar61 != 0) &&
                       (IVar41 - *(int *)((long)local_268 + uVar44 * 4 + -0x10) < 0x4000000)) {
                      IVar41 = IVar40;
                      if (IVar40 < IVar50) {
                        dVar21 = deRandom_getUint32((deRandom *)&retVal);
                        IVar41 = dVar21 % (IVar50 - IVar40) + IVar40;
                      }
                      (&rnd_4.x)[uVar44] = IVar41;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar27 != uVar44);
                  memcpy(&random,&rnd_4,(size_t)local_2b8);
                  aVar46 = local_2c0;
                  memcpy((void *)local_2c0,&rnd_4,(size_t)local_2b8);
                }
                aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + local_2d0);
                iVar61 = iVar61 + 1;
                lVar24 = local_2f0;
              } while (iVar61 != (int)local_2f8);
            }
            break;
          case 9:
            GVar66 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_HALF);
            lVar24 = local_2f0;
            GVar67 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_HALF);
            local_2d8 = (char *)operator_new__((long)(((int)local_2f8 + -1) * (int)local_2d0 +
                                                     (int)lVar24) + local_2a8 * 2);
            deRandom_init(&random.m_rnd,dVar21);
            if (0 < (int)local_2f8) {
              pcVar58 = local_2d8 + lVar24;
              local_2c0 = (anon_union_8_10_1f5805e9_for_GLValue_1)(local_2a8 & 0xffffffff);
              __n = (long)local_2c0 * 2;
              local_2b8 = (char *)((ulong)local_2b8 & 0xffffffff00000000);
              do {
                if (0 < (int)(float)local_2a8) {
                  aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)0x0;
                  do {
                    uVar54 = GVar67.field_1._0_2_;
                    local_2fc.m_value._0_2_ = uVar54;
                    FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                             convert<unsigned_short,5,10,15,3u>
                                       ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                    FVar12.m_value = GVar66.type._0_2_;
                    local_2fc.m_value._0_2_ = FVar12.m_value;
                    FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                             convert<unsigned_short,5,10,15,3u>
                                       ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                    FVar10.m_value = FVar12.m_value;
                    if ((float)FVar20.m_value <= (float)FVar19.m_value) {
                      local_2fc.m_value._0_2_ = uVar54;
                      FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      local_2fc.m_value._0_2_ = FVar12.m_value;
                      FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      fVar63 = deRandom_getFloat(&random.m_rnd);
                      local_2fc.m_value =
                           (StorageType)
                           (fVar63 * ((float)FVar19.m_value - (float)FVar20.m_value) +
                           FVar20.m_value);
                      FVar10 = tcu::Float<unsigned_short,5,10,15,1u>::
                               convert<unsigned_int,8,23,127,3u>(&local_2fc);
                    }
                    *(StorageType_conflict *)((long)&rnd_4.x + (long)aVar46 * 2) = FVar10.m_value;
                    if (local_2b8._0_4_ != 0.0) {
                      local_2fc.m_value._0_2_ = FVar10.m_value;
                      FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      local_2fc.m_value._0_2_ =
                           *(undefined2 *)((long)retVal.m_data + (long)aVar46 * 2);
                      local_2fc = tcu::Float<unsigned_int,8,23,127,3u>::
                                  convert<unsigned_short,5,10,15,3u>
                                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      local_2fc.m_value = (StorageType)(FVar19.m_value - local_2fc.m_value);
                      FVar10 = tcu::Float<unsigned_short,5,10,15,1u>::
                               convert<unsigned_int,8,23,127,3u>(&local_2fc);
                      local_2fc.m_value._0_2_ = FVar10.m_value;
                      local_2fc = tcu::Float<unsigned_int,8,23,127,3u>::
                                  convert<unsigned_short,5,10,15,3u>
                                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      local_2fc.m_value = local_2fc.m_value & 0x7fffffff;
                      FVar10 = tcu::Float<unsigned_short,5,10,15,1u>::
                               convert<unsigned_int,8,23,127,3u>(&local_2fc);
                      local_2fc.m_value = 0x40800000;
                      FVar11 = tcu::Float<unsigned_short,5,10,15,1u>::
                               convert<unsigned_int,8,23,127,3u>(&local_2fc);
                      local_2fc.m_value._0_2_ = FVar10;
                      FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      local_2fc.m_value._0_2_ = FVar11.m_value;
                      FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                      if ((float)FVar19.m_value < (float)FVar20.m_value) {
                        local_2fc.m_value._0_2_ = uVar54;
                        FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                        local_2fc.m_value._0_2_ = FVar12.m_value;
                        FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                        if ((float)FVar20.m_value <= (float)FVar19.m_value) {
                          local_2fc.m_value._0_2_ = uVar54;
                          FVar19 = tcu::Float<unsigned_int,8,23,127,3u>::
                                   convert<unsigned_short,5,10,15,3u>
                                             ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                          local_2fc.m_value._0_2_ = FVar12.m_value;
                          FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                   convert<unsigned_short,5,10,15,3u>
                                             ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2fc);
                          fVar63 = deRandom_getFloat(&random.m_rnd);
                          local_2fc.m_value =
                               (StorageType)
                               (fVar63 * ((float)FVar19.m_value - (float)FVar20.m_value) +
                               FVar20.m_value);
                          FVar12 = tcu::Float<unsigned_short,5,10,15,1u>::
                                   convert<unsigned_int,8,23,127,3u>(&local_2fc);
                        }
                        *(StorageType_conflict *)((long)&rnd_4.x + (long)aVar46 * 2) =
                             FVar12.m_value;
                      }
                    }
                    aVar46 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar46 + 1);
                  } while (local_2c0 != aVar46);
                  memcpy(&retVal,&rnd_4,__n);
                  memcpy(pcVar58,&rnd_4,__n);
                  lVar24 = local_2f0;
                }
                pcVar58 = pcVar58 + local_2d0;
                iVar61 = (int)local_2b8._0_4_ + 1;
                local_2b8 = (char *)CONCAT44(local_2b8._4_4_,iVar61);
              } while (iVar61 != (int)local_2f8);
            }
          }
        }
        else {
          local_2d8 = (char *)0x0;
          lVar24 = local_2f0;
        }
        pDVar47 = local_2e0;
        SVar5 = attribSpec.storage;
        AttributePack::newArray(local_2e0->m_glArrayPack,attribSpec.storage);
        AttributePack::newArray(pDVar47->m_rrArrayPack,SVar5);
        ppAVar7 = (pDVar47->m_glArrayPack->m_arrays).
                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (uVar55 < (ulong)((long)(pDVar47->m_glArrayPack->m_arrays).
                                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3))
        {
          sVar43 = lVar24 + iVar15 + (local_2f8 - 1) * local_2d0;
          usage = attribSpec.usage;
          anon_unknown_1::AttributeArray::data
                    (ppAVar7[uVar55],TARGET_ARRAY,sVar43,local_2d8,attribSpec.usage);
          ppAVar7 = (local_2e0->m_rrArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (uVar55 < (ulong)((long)(local_2e0->m_rrArrayPack->m_arrays).
                                     super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3
                              )) {
            anon_unknown_1::AttributeArray::data
                      (ppAVar7[uVar55],TARGET_ARRAY,sVar43,local_2d8,usage);
            ppAVar7 = (local_2e0->m_glArrayPack->m_arrays).
                      super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (uVar55 < (ulong)((long)(local_2e0->m_glArrayPack->m_arrays).
                                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >>
                                3)) {
              pAVar28 = ppAVar7[uVar55];
              pAVar28->m_componentCount = attribSpec.componentCount;
              pAVar28->m_bound = true;
              pAVar28->m_inputType = attribSpec.inputType;
              pAVar28->m_outputType = attribSpec.outputType;
              pAVar28->m_normalize = attribSpec.normalize;
              pAVar28->m_stride = attribSpec.stride;
              pAVar28->m_offset = attribSpec.offset;
              *(undefined8 *)&(pAVar28->m_defaultAttrib).v = 0;
              *(undefined8 *)((long)&(pAVar28->m_defaultAttrib).v + 8) = 0;
              pAVar28->m_instanceDivisor = attribSpec.instanceDivisor;
              pAVar28->m_isPositionAttr = (bool)(local_2c1 & 1);
              pAVar28->m_bgraOrder = attribSpec.bgraComponentOrder;
              ppAVar7 = (local_2e0->m_rrArrayPack->m_arrays).
                        super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (uVar55 < (ulong)((long)(local_2e0->m_rrArrayPack->m_arrays).
                                         super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7
                                  >> 3)) {
                pAVar28 = ppAVar7[uVar55];
                pAVar28->m_componentCount = attribSpec.componentCount;
                pAVar28->m_bound = true;
                pAVar28->m_inputType = attribSpec.inputType;
                pAVar28->m_outputType = attribSpec.outputType;
                pAVar28->m_normalize = attribSpec.normalize;
                pAVar28->m_stride = attribSpec.stride;
                pAVar28->m_offset = attribSpec.offset;
                *(undefined8 *)&(pAVar28->m_defaultAttrib).v = 0;
                *(undefined8 *)((long)&(pAVar28->m_defaultAttrib).v + 8) = 0;
                pAVar28->m_instanceDivisor = attribSpec.instanceDivisor;
                pAVar28->m_isPositionAttr = (bool)(local_2c1 & 1);
                pAVar28->m_bgraOrder = attribSpec.bgraComponentOrder;
                if (local_2d8 != (char *)0x0) {
                  operator_delete__(local_2d8);
                }
                goto LAB_0186922d;
              }
            }
          }
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar55);
LAB_0186a5d2:
        uVar29 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,uVar55);
        if ((DrawTest *)attribSpec._0_8_ != pDVar47) {
          operator_delete((void *)attribSpec._0_8_,attribSpec._16_8_ + 1);
        }
        if (sectionEmitter.m_enabled == true) {
          tcu::TestLog::endSection(sectionEmitter.m_log);
        }
        _Unwind_Resume(uVar29);
      }
      pDVar47 = (DrawTest *)&random;
      deRandom_init((deRandom *)pDVar47,(int)uVar55 + iVar61 * 10 + iVar14 * 100);
      if (IVar50 == INPUTTYPE_UNSIGNED_INT) {
        retVal.m_data[0] = 0.0;
        retVal.m_data[1] = 0.0;
        retVal.m_data[2] = 0.0;
        retVal.m_data[3] = 0.0;
        lVar24 = 0;
        do {
          fVar63 = (float)deRandom_getUint32((deRandom *)pDVar47);
          retVal.m_data[lVar24] = fVar63;
          lVar24 = lVar24 + 1;
          pcVar58 = (char *)retVal.m_data._0_8_;
          uVar65 = retVal.m_data._8_8_;
        } while (lVar24 != 4);
      }
      else if (IVar50 == INPUTTYPE_INT) {
        retVal.m_data[0] = 0.0;
        retVal.m_data[1] = 0.0;
        retVal.m_data[2] = 0.0;
        retVal.m_data[3] = 0.0;
        lVar24 = 0;
        do {
          fVar63 = (float)deRandom_getUint32((deRandom *)pDVar47);
          retVal.m_data[lVar24] = fVar63;
          lVar24 = lVar24 + 1;
          pcVar58 = (char *)retVal.m_data._0_8_;
          uVar65 = retVal.m_data._8_8_;
        } while (lVar24 != 4);
      }
      else {
        uVar65._0_4_ = 1.0;
        uVar65._4_4_ = 1.0;
        pcVar58 = (char *)0x3f8000003f800000;
        if (IVar50 == INPUTTYPE_FLOAT) {
          retVal.m_data[0] = 0.0;
          retVal.m_data[1] = 0.0;
          retVal.m_data[2] = 0.0;
          retVal.m_data[3] = 0.0;
          lVar24 = 0;
          do {
            fVar63 = deRandom_getFloat((deRandom *)pDVar47);
            retVal.m_data[lVar24] = fVar63;
            lVar24 = lVar24 + 1;
            pcVar58 = (char *)retVal.m_data._0_8_;
            uVar65 = retVal.m_data._8_8_;
          } while (lVar24 != 4);
        }
      }
      local_2b8 = pcVar58;
      afStack_2b0 = (float  [2])uVar65;
      AttributePack::newArray(local_2e0->m_glArrayPack,STORAGE_USER);
      AttributePack::newArray(local_2e0->m_rrArrayPack,STORAGE_USER);
      ppAVar7 = (local_2e0->m_glArrayPack->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_2e0->m_glArrayPack->m_arrays).
                        super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <= uVar55)
      goto LAB_0186a5d2;
      pAVar28 = ppAVar7[uVar55];
      pAVar28->m_componentCount = attribSpec.componentCount;
      pAVar28->m_bound = false;
      pAVar28->m_inputType = IVar50;
      pAVar28->m_outputType = attribSpec.outputType;
      pAVar28->m_normalize = false;
      pAVar28->m_stride = 0;
      pAVar28->m_offset = 0;
      *(char **)&(pAVar28->m_defaultAttrib).v = local_2b8;
      *(float (*) [2])((long)&(pAVar28->m_defaultAttrib).v + 8) = afStack_2b0;
      pAVar28->m_instanceDivisor = 0;
      pAVar28->m_isPositionAttr = (bool)(local_2c1 & 1);
      pAVar28->m_bgraOrder = false;
      ppAVar7 = (local_2e0->m_rrArrayPack->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_2e0->m_rrArrayPack->m_arrays).
                        super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <= uVar55)
      goto LAB_0186a5d2;
      pAVar28 = ppAVar7[uVar55];
      pAVar28->m_componentCount = attribSpec.componentCount;
      pAVar28->m_bound = false;
      pAVar28->m_inputType = IVar50;
      pAVar28->m_outputType = attribSpec.outputType;
      pAVar28->m_normalize = false;
      pAVar28->m_stride = 0;
      pAVar28->m_offset = 0;
      *(char **)&(pAVar28->m_defaultAttrib).v = local_2b8;
      *(float (*) [2])((long)&(pAVar28->m_defaultAttrib).v + 8) = afStack_2b0;
      pAVar28->m_instanceDivisor = 0;
      pAVar28->m_isPositionAttr = (bool)(local_2c1 & 1);
      pAVar28->m_bgraOrder = false;
LAB_0186922d:
      uVar55 = uVar55 + 1;
      pAVar26 = (local_2a0->attribs).
                super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar55 <
             (long)((int)((ulong)((long)(local_2a0->attribs).
                                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar26)
                         >> 3) * -0x33333333));
  }
  if (bVar62) {
    AttributePack::updateProgram(local_2e0->m_glArrayPack);
    AttributePack::updateProgram(local_2e0->m_rrArrayPack);
  }
  pDVar8 = local_2a0;
  this = local_2e0;
  if ((uVar51 & 1) == 0) {
    AttributePack::render
              (local_2e0->m_glArrayPack,local_2a0->primitive,local_2a0->drawMethod,local_2a0->first,
               iVar39,INDEXTYPE_LAST,(void *)0x0,0,0,local_2a0->instanceCount,
               local_2a0->indirectOffset,0,(float)local_268[1]._12_4_,(float)local_268[1]._8_4_,
               (AttributeArray *)0x0);
    AttributePack::render
              (this->m_rrArrayPack,pDVar8->primitive,pDVar8->drawMethod,pDVar8->first,iVar39,
               INDEXTYPE_LAST,(void *)0x0,0,0,pDVar8->instanceCount,pDVar8->indirectOffset,0,
               (float)local_268[1]._12_4_,(float)local_268[1]._8_4_,(AttributeArray *)0x0);
  }
  else {
    dVar21 = DrawTestSpec::hash(local_2a0);
    IVar4 = pDVar8->indexType;
    local_2d0 = (long)DrawTestSpec::indexTypeSize::size[(int)IVar4];
    local_2c0 = (anon_union_8_10_1f5805e9_for_GLValue_1)(long)pDVar8->indexPointerOffset;
    uVar51 = (uint)uVar25;
    if ((long)(int)IVar4 == 2) {
      local_2b8 = (char *)operator_new__((long)local_2c0 + (long)(int)uVar51 * 4);
      deRandom_init(&random.m_rnd,dVar21);
      pcVar58 = local_2b8;
      aVar46 = local_2c0;
      if (0 < (int)uVar51) {
        uVar45 = local_2e4 - uVar30;
        uVar55 = 0;
        uVar42 = 0xffffffff;
        uVar31 = 0xffffffff;
        do {
          uVar22 = uVar42;
          uVar42 = uVar30;
          if (uVar30 < local_2e4) {
            dVar21 = deRandom_getUint32(&random.m_rnd);
            uVar42 = dVar21 % uVar45 + uVar30;
          }
          uVar42 = (uVar42 == uVar22) + uVar42;
          uVar23 = uVar30;
          if (uVar42 <= local_2e4) {
            uVar23 = uVar42;
          }
          uVar23 = (uVar23 == uVar31) + uVar23;
          uVar31 = uVar30;
          if (uVar23 <= local_2e4) {
            uVar31 = uVar23;
          }
          uVar31 = (uVar31 == uVar22) + uVar31;
          uVar42 = uVar30;
          if (uVar31 <= local_2e4) {
            uVar42 = uVar31;
          }
          *(uint *)(pcVar58 + uVar55 * 4 + (long)aVar46) = uVar3 + uVar42;
          uVar55 = uVar55 + 1;
          uVar31 = uVar22;
        } while ((uVar51 & 0x7fffffff) != uVar55);
      }
    }
    else if (IVar4 == INDEXTYPE_SHORT) {
      local_2b8 = (char *)operator_new__((long)local_2c0 + (long)(int)uVar51 * 2);
      deRandom_init(&random.m_rnd,dVar21);
      pcVar58 = local_2b8;
      aVar46 = local_2c0;
      if (0 < (int)uVar51) {
        uVar45 = local_2e4 - uVar30;
        uVar55 = 0;
        uVar42 = 0xffffffff;
        uVar31 = 0xffffffff;
        do {
          uVar22 = uVar42;
          uVar42 = uVar30;
          if (uVar30 < local_2e4) {
            dVar21 = deRandom_getUint32(&random.m_rnd);
            uVar42 = dVar21 % uVar45 + uVar30;
          }
          uVar42 = (uVar42 == uVar22) + uVar42;
          uVar23 = uVar30;
          if (uVar42 <= local_2e4) {
            uVar23 = uVar42;
          }
          uVar23 = (uVar23 == uVar31) + uVar23;
          uVar31 = uVar30;
          if (uVar23 <= local_2e4) {
            uVar31 = uVar23;
          }
          uVar31 = (uVar31 == uVar22) + uVar31;
          uVar42 = uVar30;
          if (uVar31 <= local_2e4) {
            uVar42 = uVar31;
          }
          *(short *)(pcVar58 + uVar55 * 2 + (long)aVar46) = (short)uVar3 + (short)uVar42;
          uVar55 = uVar55 + 1;
          uVar31 = uVar22;
        } while ((uVar51 & 0x7fffffff) != uVar55);
      }
    }
    else if (IVar4 == INDEXTYPE_BYTE) {
      local_2b8 = (char *)operator_new__((long)(int)uVar51 + (long)local_2c0);
      deRandom_init(&random.m_rnd,dVar21);
      pcVar58 = local_2b8;
      aVar46 = local_2c0;
      if (0 < (int)uVar51) {
        uVar45 = local_2e4 - uVar30;
        uVar55 = 0;
        uVar42 = 0xffffffff;
        uVar31 = 0xffffffff;
        do {
          uVar22 = uVar42;
          uVar42 = uVar30;
          if (uVar30 < local_2e4) {
            dVar21 = deRandom_getUint32(&random.m_rnd);
            uVar42 = dVar21 % uVar45 + uVar30;
          }
          uVar42 = (uVar42 == uVar22) + uVar42;
          uVar23 = uVar30;
          if (uVar42 <= local_2e4) {
            uVar23 = uVar42;
          }
          uVar23 = (uVar23 == uVar31) + uVar23;
          uVar31 = uVar30;
          if (uVar23 <= local_2e4) {
            uVar31 = uVar23;
          }
          uVar31 = (uVar31 == uVar22) + uVar31;
          uVar42 = uVar30;
          if (uVar31 <= local_2e4) {
            uVar42 = uVar31;
          }
          pcVar58[uVar55 + (long)aVar46] = (char)uVar3 + (char)uVar42;
          uVar55 = uVar55 + 1;
          uVar31 = uVar22;
        } while ((uVar51 & 0x7fffffff) != uVar55);
      }
    }
    else {
      local_2b8 = (char *)0x0;
    }
    SVar5 = local_2a0->indexStorage;
    pcVar58 = (char *)0x0;
    if (SVar5 == STORAGE_USER) {
      pcVar58 = local_2b8;
    }
    iVar61 = local_2a0->indexPointerOffset;
    pAVar28 = (AttributeArray *)operator_new(0x58);
    anon_unknown_1::AttributeArray::AttributeArray(pAVar28,SVar5,local_2e0->m_glesContext);
    attribSpec._0_8_ = pAVar28;
    this_01 = (AttributeArray *)operator_new(0x58);
    pcVar64 = local_2b8;
    anon_unknown_1::AttributeArray::AttributeArray
              (this_01,local_2a0->indexStorage,&local_2e0->m_refContext->super_Context);
    sVar43 = uVar25 * local_2d0 + (long)local_2c0;
    random.m_rnd._0_8_ = this_01;
    anon_unknown_1::AttributeArray::data
              (pAVar28,TARGET_ELEMENT_ARRAY,sVar43,pcVar64,USAGE_STATIC_DRAW);
    anon_unknown_1::AttributeArray::data
              (this_01,TARGET_ELEMENT_ARRAY,sVar43,pcVar64,USAGE_STATIC_DRAW);
    AttributePack::render
              (local_2e0->m_glArrayPack,local_2a0->primitive,local_2a0->drawMethod,0,iVar39,
               local_2a0->indexType,pcVar58 + iVar61,local_2a0->indexMin,local_2a0->indexMax,
               local_2a0->instanceCount,local_2a0->indirectOffset,local_2a0->baseVertex,
               (float)local_268[1]._12_4_,(float)local_268[1]._8_4_,pAVar28);
    AttributePack::render
              (local_2e0->m_rrArrayPack,local_2a0->primitive,local_2a0->drawMethod,0,iVar39,
               local_2a0->indexType,pcVar58 + iVar61,local_2a0->indexMin,local_2a0->indexMax,
               local_2a0->instanceCount,local_2a0->indirectOffset,local_2a0->baseVertex,
               (float)local_268[1]._12_4_,(float)local_268[1]._8_4_,
               (AttributeArray *)random.m_rnd._0_8_);
    if (pcVar64 != (char *)0x0) {
      operator_delete__(pcVar64);
    }
    de::details::
    UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
    ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                   *)&random);
    de::details::
    UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
    ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                   *)&attribSpec);
    this = local_2e0;
  }
LAB_0186a56e:
  tcu::ResultCollector::setTestContextResult
            (&this->m_result,(this->super_TestCase).super_TestNode.m_testCtx);
  this->m_iteration = this->m_iteration + 1;
  if ((sectionEmitter.m_enabled & 1U) != 0) {
    tcu::TestLog::endSection(sectionEmitter.m_log);
  }
  return (uint)((long)iVar2 + 1 != lVar32 * -0x6666666666666666);
}

Assistant:

DrawTest::IterateResult DrawTest::iterate (void)
{
	const int					specNdx			= (m_iteration / 2);
	const bool					drawStep		= (m_iteration % 2) == 0;
	const bool					compareStep		= (m_iteration % 2) == 1;
	const IterateResult			iterateResult	= ((size_t)m_iteration + 1 == m_specs.size()*2) ? (STOP) : (CONTINUE);
	const DrawTestSpec&			spec			= m_specs[specNdx];
	const bool					updateProgram	= (m_iteration == 0) || (drawStep && !checkSpecsShaderCompatible(m_specs[specNdx], m_specs[specNdx-1])); // try to use the same shader in all iterations
	IterationLogSectionEmitter	sectionEmitter	(m_testCtx.getLog(), specNdx, m_specs.size(), m_iteration_descriptions[specNdx], drawStep && m_specs.size()!=1);

	if (drawStep)
	{
		const MethodInfo	methodInfo				= getMethodInfo(spec.drawMethod);
		const bool			indexed					= methodInfo.indexed;
		const bool			instanced				= methodInfo.instanced;
		const bool			ranged					= methodInfo.ranged;
		const bool			hasFirst				= methodInfo.first;
		const bool			hasBaseVtx				= methodInfo.baseVertex;

		const size_t		primitiveElementCount	= getElementCount(spec.primitive, spec.primitiveCount);						// !< elements to be drawn
		const int			indexMin				= (ranged) ? (spec.indexMin) : (0);
		const int			firstAddition			= (hasFirst) ? (spec.first) : (0);
		const int			baseVertexAddition		= (hasBaseVtx && spec.baseVertex > 0) ? ( spec.baseVertex) : (0);			// spec.baseVertex > 0 => Create bigger attribute buffer
		const int			indexBase				= (hasBaseVtx && spec.baseVertex < 0) ? (-spec.baseVertex) : (0);			// spec.baseVertex < 0 => Create bigger indices
		const size_t		elementCount			= primitiveElementCount + indexMin + firstAddition + baseVertexAddition;	// !< elements in buffer (buffer should have at least primitiveElementCount ACCESSIBLE (index range, first) elements)
		const int			maxElementIndex			= (int)primitiveElementCount + indexMin + firstAddition - 1;
		const int			indexMax				= de::max(0, (ranged) ? (de::clamp<int>(spec.indexMax, 0, maxElementIndex)) : (maxElementIndex));
		float				coordScale				= getCoordScale(spec);
		float				colorScale				= getColorScale(spec);

		rr::GenericVec4		nullAttribValue;

		// Log info
		m_testCtx.getLog() << TestLog::Message << spec.getMultilineDesc() << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << TestLog::EndMessage; // extra line for clarity

		// Data

		m_glArrayPack->clearArrays();
		m_rrArrayPack->clearArrays();

		for (int attribNdx = 0; attribNdx < (int)spec.attribs.size(); attribNdx++)
		{
			DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[attribNdx];
			const bool					isPositionAttr	= (attribNdx == 0) || (attribSpec.additionalPositionAttribute);

			if (attribSpec.useDefaultAttribute)
			{
				const int		seed		= 10 * attribSpec.hash() + 100 * spec.hash() + attribNdx;
				rr::GenericVec4 attribValue = RandomArrayGenerator::generateAttributeValue(seed, attribSpec.inputType);

				m_glArrayPack->newArray(DrawTestSpec::STORAGE_USER);
				m_rrArrayPack->newArray(DrawTestSpec::STORAGE_USER);

				m_glArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
				m_rrArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
			}
			else
			{
				const int					seed					= attribSpec.hash() + 100 * spec.hash() + attribNdx;
				const size_t				elementSize				= attribSpec.componentCount * DrawTestSpec::inputTypeSize(attribSpec.inputType);
				const size_t				stride					= (attribSpec.stride == 0) ? (elementSize) : (attribSpec.stride);
				const size_t				evaluatedElementCount	= (instanced && attribSpec.instanceDivisor > 0) ? (spec.instanceCount / attribSpec.instanceDivisor + 1) : (elementCount);
				const size_t				referencedElementCount	= (ranged) ? (de::max<size_t>(evaluatedElementCount, spec.indexMax + 1)) : (evaluatedElementCount);
				const size_t				bufferSize				= attribSpec.offset + stride * (referencedElementCount - 1) + elementSize;
				const char*					data					= RandomArrayGenerator::generateArray(seed, (int)referencedElementCount, attribSpec.componentCount, attribSpec.offset, (int)stride, attribSpec.inputType);

				try
				{
					m_glArrayPack->newArray(attribSpec.storage);
					m_rrArrayPack->newArray(attribSpec.storage);

					m_glArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);
					m_rrArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);

					m_glArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);
					m_rrArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);

					delete [] data;
					data = NULL;
				}
				catch (...)
				{
					delete [] data;
					throw;
				}
			}
		}

		// Shader program
		if (updateProgram)
		{
			m_glArrayPack->updateProgram();
			m_rrArrayPack->updateProgram();
		}

		// Draw
		try
		{
			// indices
			if (indexed)
			{
				const int		seed				= spec.hash();
				const size_t	indexElementSize	= DrawTestSpec::indexTypeSize(spec.indexType);
				const size_t	indexArraySize		= spec.indexPointerOffset + indexElementSize * elementCount;
				const char*		indexArray			= RandomArrayGenerator::generateIndices(seed, (int)elementCount, spec.indexType, spec.indexPointerOffset, indexMin, indexMax, indexBase);
				const char*		indexPointerBase	= (spec.indexStorage == DrawTestSpec::STORAGE_USER) ? (indexArray) : ((char*)DE_NULL);
				const char*		indexPointer		= indexPointerBase + spec.indexPointerOffset;

				de::UniquePtr<AttributeArray> glArray	(new AttributeArray(spec.indexStorage, *m_glesContext));
				de::UniquePtr<AttributeArray> rrArray	(new AttributeArray(spec.indexStorage, *m_refContext));

				try
				{
					glArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);
					rrArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);

					m_glArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, glArray.get());
					m_rrArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, rrArray.get());

					delete [] indexArray;
					indexArray = NULL;
				}
				catch (...)
				{
					delete [] indexArray;
					throw;
				}
			}
			else
			{
				m_glArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
				m_rrArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
			}
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;
		}
	}
	else if (compareStep)
	{
		if (!compare(spec.primitive))
		{
			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_result.addResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}

	m_result.setTestContextResult(m_testCtx);

	m_iteration++;
	return iterateResult;
}